

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void UnaryExpression_minus_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined1 local_58 [8];
  JsValue r2;
  JsValue r1;
  JsAstUnaryNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  (*JsNodeClassEval[**(uint **)(na + 1)])
            (*(JsAstNode **)(na + 1),context,(JsValue *)((long)&r2.u + 8));
  JsGetValue((JsValue *)((long)&r2.u + 8),(JsValue *)local_58);
  JsToNumber((JsValue *)local_58,res);
  res->type = JS_NUMBER;
  (res->u).object = (JsObject *)((ulong)(res->u).object ^ 0x8000000000000000);
  return;
}

Assistant:

static void
UnaryExpression_minus_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1, r2;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, &r2);
	JsToNumber( &r2, res);
	res->type =JS_NUMBER;
	res->u.number = -(res->u.number);
}